

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

void __thiscall
cmListFileParser::cmListFileParser
          (cmListFileParser *this,cmListFile *lf,cmListFileBacktrace *lfbt,cmMessenger *messenger,
          char *filename)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  cmListFileLexer *pcVar2;
  
  this->ListFile = lf;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (lfbt->TopEntry).
       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (lfbt->TopEntry).
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (lfbt->TopEntry).super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  (lfbt->TopEntry).super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  this->Messenger = messenger;
  this->FileName = filename;
  pcVar2 = cmListFileLexer_New();
  this->Lexer = pcVar2;
  (this->Function).super_cmCommandContext.Name.Lower._M_dataplus._M_p =
       (pointer)&(this->Function).super_cmCommandContext.Name.Lower.field_2;
  (this->Function).super_cmCommandContext.Name.Lower._M_string_length = 0;
  (this->Function).super_cmCommandContext.Name.Lower.field_2._M_local_buf[0] = '\0';
  (this->Function).super_cmCommandContext.Name.Original._M_dataplus._M_p =
       (pointer)&(this->Function).super_cmCommandContext.Name.Original.field_2;
  (this->Function).super_cmCommandContext.Name.Original._M_string_length = 0;
  (this->Function).super_cmCommandContext.Name.Original.field_2._M_local_buf[0] = '\0';
  (this->Function).super_cmCommandContext.Line = 0;
  (this->Function).super_cmCommandContext.Col = 0;
  (this->Function).super_cmCommandContext.EndLine = 0;
  (this->Function).super_cmCommandContext.EndCol = 0;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

cmListFileParser::cmListFileParser(cmListFile* lf, cmListFileBacktrace lfbt,
                                   cmMessenger* messenger,
                                   const char* filename)
  : ListFile(lf)
  , Backtrace(std::move(lfbt))
  , Messenger(messenger)
  , FileName(filename)
  , Lexer(cmListFileLexer_New())
{
}